

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

char * BinaryenSwitchGetNameAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  Name *pNVar1;
  
  if (expr->_id != SwitchId) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x866,"const char *BinaryenSwitchGetNameAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < expr[1].type.id) {
    pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(expr + 1),
                        (ulong)index);
    return (pNVar1->super_IString).str._M_str;
  }
  __assert_fail("index < static_cast<Switch*>(expression)->targets.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x867,"const char *BinaryenSwitchGetNameAt(BinaryenExpressionRef, BinaryenIndex)");
}

Assistant:

const char* BinaryenSwitchGetNameAt(BinaryenExpressionRef expr,
                                    BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(index < static_cast<Switch*>(expression)->targets.size());
  return static_cast<Switch*>(expression)->targets[index].str.data();
}